

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpBase::BinaryReaderObjdumpBase
          (BinaryReaderObjdumpBase *this,uint8_t *data,size_t size,ObjdumpOptions *options,
          ObjdumpState *objdump_state)

{
  (this->super_BinaryReaderNop).super_BinaryReaderDelegate.state = (State *)0x0;
  (this->super_BinaryReaderNop).super_BinaryReaderDelegate._vptr_BinaryReaderDelegate =
       (_func_int **)&PTR__BinaryReaderObjdumpBase_0013fee0;
  this->options_ = options;
  this->objdump_state_ = objdump_state;
  this->data_ = data;
  this->size_ = size;
  this->print_details_ = false;
  this->reloc_section_ = Invalid;
  (this->section_types_).
  super__Vector_base<wabt::BinarySection,_std::allocator<wabt::BinarySection>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->section_types_).
  super__Vector_base<wabt::BinarySection,_std::allocator<wabt::BinarySection>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->section_types_).
           super__Vector_base<wabt::BinarySection,_std::allocator<wabt::BinarySection>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->section_types_).
           super__Vector_base<wabt::BinarySection,_std::allocator<wabt::BinarySection>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->module_name_)._M_dataplus._M_p = (pointer)&(this->module_name_).field_2;
  (this->module_name_)._M_string_length = 0;
  (this->module_name_).field_2._M_local_buf[0] = '\0';
  (this->current_opcode).enum_ = Unreachable;
  FileStream::CreateStderr();
  this->section_starts_[0xc] = 0;
  this->section_starts_[0xd] = 0;
  this->section_starts_[10] = 0;
  this->section_starts_[0xb] = 0;
  this->section_starts_[8] = 0;
  this->section_starts_[9] = 0;
  this->section_starts_[6] = 0;
  this->section_starts_[7] = 0;
  this->section_starts_[4] = 0;
  this->section_starts_[5] = 0;
  this->section_starts_[2] = 0;
  this->section_starts_[3] = 0;
  this->section_starts_[0] = 0;
  this->section_starts_[1] = 0;
  return;
}

Assistant:

BinaryReaderObjdumpBase::BinaryReaderObjdumpBase(const uint8_t* data,
                                                 size_t size,
                                                 ObjdumpOptions* options,
                                                 ObjdumpState* objdump_state)
    : options_(options),
      objdump_state_(objdump_state),
      data_(data),
      size_(size),
      err_stream_(FileStream::CreateStderr()) {
  ZeroMemory(section_starts_);
}